

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall ipx::IPM::StepSizes(IPM *this,Step *step,bool isCentring)

{
  int iVar1;
  uint uVar2;
  Iterate *pIVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  
  pIVar3 = this->iterate_;
  pdVar4 = (pIVar3->xl_)._M_data;
  pdVar5 = (step->xl)._M_data;
  lVar19 = -1;
  dVar24 = 1.0;
  dVar26 = 1.0;
  lVar15 = -1;
  uVar18 = (uint)(pIVar3->xl_)._M_size;
  if (0 < (int)uVar18) {
    uVar16 = 0xffffffff;
    uVar17 = 0;
    dVar26 = 1.0;
    do {
      dVar27 = dVar26 * pdVar5[uVar17] + pdVar4[uVar17];
      uVar23 = -(ulong)(dVar27 < 0.0);
      if (dVar27 < 0.0) {
        uVar16 = uVar17 & 0xffffffff;
      }
      dVar26 = (double)(~uVar23 & (ulong)dVar26 |
                       (ulong)((pdVar4[uVar17] * -0.9999999999999998) / pdVar5[uVar17]) & uVar23);
      uVar17 = uVar17 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar17);
    lVar15 = (long)(int)uVar16;
  }
  pdVar6 = (pIVar3->xu_)._M_data;
  pdVar7 = (step->xu)._M_data;
  dVar27 = 1.0;
  uVar18 = (uint)(pIVar3->xu_)._M_size;
  if (0 < (int)uVar18) {
    uVar16 = 0xffffffff;
    uVar17 = 0;
    dVar27 = 1.0;
    do {
      dVar29 = dVar27 * pdVar7[uVar17] + pdVar6[uVar17];
      uVar23 = -(ulong)(dVar29 < 0.0);
      if (dVar29 < 0.0) {
        uVar16 = uVar17 & 0xffffffff;
      }
      dVar27 = (double)(~uVar23 & (ulong)dVar27 |
                       (ulong)((pdVar6[uVar17] * -0.9999999999999998) / pdVar7[uVar17]) & uVar23);
      uVar17 = uVar17 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar17);
    lVar19 = (long)(int)uVar16;
  }
  pdVar8 = (pIVar3->zl_)._M_data;
  pdVar9 = (step->zl)._M_data;
  lVar21 = -1;
  dVar29 = 1.0;
  lVar14 = -1;
  uVar18 = (uint)(pIVar3->zl_)._M_size;
  if (0 < (int)uVar18) {
    uVar16 = 0xffffffff;
    uVar17 = 0;
    dVar29 = 1.0;
    do {
      dVar30 = dVar29 * pdVar9[uVar17] + pdVar8[uVar17];
      uVar23 = -(ulong)(dVar30 < 0.0);
      if (dVar30 < 0.0) {
        uVar16 = uVar17 & 0xffffffff;
      }
      dVar29 = (double)(~uVar23 & (ulong)dVar29 |
                       (ulong)((pdVar8[uVar17] * -0.9999999999999998) / pdVar9[uVar17]) & uVar23);
      uVar17 = uVar17 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar17);
    lVar14 = (long)(int)uVar16;
  }
  iVar20 = pIVar3->model_->num_rows_;
  iVar1 = pIVar3->model_->num_cols_;
  pdVar10 = (pIVar3->zu_)._M_data;
  pdVar12 = (step->zu)._M_data;
  uVar18 = (uint)(pIVar3->zu_)._M_size;
  if (0 < (int)uVar18) {
    uVar16 = 0xffffffff;
    uVar17 = 0;
    dVar24 = 1.0;
    do {
      dVar30 = dVar24 * pdVar12[uVar17] + pdVar10[uVar17];
      uVar23 = -(ulong)(dVar30 < 0.0);
      if (dVar30 < 0.0) {
        uVar16 = uVar17 & 0xffffffff;
      }
      dVar24 = (double)(~uVar23 & (ulong)dVar24 |
                       (ulong)((pdVar10[uVar17] * -0.9999999999999998) / pdVar12[uVar17]) & uVar23);
      uVar17 = uVar17 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar17);
    lVar21 = (long)(int)uVar16;
  }
  dVar30 = dVar27;
  if (dVar26 <= dVar27) {
    dVar30 = dVar26;
  }
  dVar30 = (double)(~-(ulong)NAN(dVar26) & (ulong)dVar30 | -(ulong)NAN(dVar26) & (ulong)dVar27);
  uVar32 = SUB84(dVar24,0);
  uVar33 = (undefined4)((ulong)dVar24 >> 0x20);
  if (dVar29 <= dVar24) {
    uVar32 = SUB84(dVar29,0);
    uVar33 = (undefined4)((ulong)dVar29 >> 0x20);
  }
  dVar28 = (double)(~-(ulong)NAN(dVar29) & CONCAT44(uVar33,uVar32) |
                   -(ulong)NAN(dVar29) & (ulong)dVar24);
  uVar18 = iVar1 + iVar20;
  if (uVar18 == 0 || SCARRY4(iVar1,iVar20) != (int)uVar18 < 0) {
    dVar31 = NAN;
  }
  else {
    lVar22 = 0;
    dVar31 = 0.0;
    iVar20 = 0;
    do {
      uVar2 = *(uint *)((long)(pIVar3->variable_state_).
                              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar22);
      if ((uVar2 & 0xfffffffd) == 0) {
        dVar31 = dVar31 + (*(double *)((long)pdVar9 + lVar22 * 2) * dVar28 +
                          *(double *)((long)pdVar8 + lVar22 * 2)) *
                          (*(double *)((long)pdVar5 + lVar22 * 2) * dVar30 +
                          *(double *)((long)pdVar4 + lVar22 * 2));
        iVar20 = iVar20 + 1;
      }
      if (uVar2 - 1 < 2) {
        dVar31 = dVar31 + (*(double *)((long)pdVar12 + lVar22 * 2) * dVar28 +
                          *(double *)((long)pdVar10 + lVar22 * 2)) *
                          (*(double *)((long)pdVar7 + lVar22 * 2) * dVar30 +
                          *(double *)((long)pdVar6 + lVar22 * 2));
        iVar20 = iVar20 + 1;
      }
      lVar22 = lVar22 + 4;
    } while ((ulong)uVar18 << 2 != lVar22);
    dVar31 = dVar31 / (double)iVar20;
  }
  dVar31 = dVar31 / 10.000000000000002;
  uVar32 = 0;
  uVar33 = 0x3ff00000;
  if (dVar30 < 1.0) {
    if (dVar26 <= dVar27) {
      dVar26 = pdVar4[lVar15] - dVar31 / (pdVar9[lVar15] * dVar28 + pdVar8[lVar15]);
      pdVar13 = pdVar5 + lVar15;
    }
    else {
      dVar26 = pdVar6[lVar19] - dVar31 / (pdVar12[lVar19] * dVar28 + pdVar10[lVar19]);
      pdVar13 = pdVar7 + lVar19;
    }
    dVar27 = dVar30 * 0.9;
    if (dVar30 * 0.9 <= dVar26 / -*pdVar13) {
      dVar27 = dVar26 / -*pdVar13;
    }
    uVar32 = 0;
    uVar33 = 0x3ff00000;
    if (dVar27 <= 1.0) {
      uVar32 = SUB84(dVar27,0);
      uVar33 = (undefined4)((ulong)dVar27 >> 0x20);
    }
  }
  dVar26 = 1.0;
  if (dVar28 < 1.0) {
    if (dVar29 <= dVar24) {
      dVar26 = pdVar8[lVar14] - dVar31 / (pdVar5[lVar14] * dVar30 + pdVar4[lVar14]);
      pdVar12 = pdVar9 + lVar14;
    }
    else {
      dVar26 = pdVar10[lVar21] - dVar31 / (pdVar7[lVar21] * dVar30 + pdVar6[lVar21]);
      pdVar12 = pdVar12 + lVar21;
    }
    dVar24 = dVar28 * 0.9;
    if (dVar28 * 0.9 <= dVar26 / -*pdVar12) {
      dVar24 = dVar26 / -*pdVar12;
    }
    dVar26 = 1.0;
    if (dVar24 <= 1.0) {
      dVar26 = dVar24;
    }
  }
  auVar25._4_4_ = uVar33;
  auVar25._0_4_ = uVar32;
  auVar25._8_4_ = SUB84(dVar26,0);
  auVar25._12_4_ = (int)((ulong)dVar26 >> 0x20);
  auVar25 = minpd(_DAT_003dc300,auVar25);
  this->step_primal_ = (double)auVar25._0_8_;
  this->step_dual_ = (double)auVar25._8_8_;
  if (isCentring) {
    dVar24 = (this->control_->parameters_).super_ipx_parameters.centring_alpha_scaling;
    dVar27 = (double)CONCAT44(uVar33,uVar32) * dVar24;
    dVar26 = dVar26 * dVar24;
    auVar11._8_4_ = SUB84(dVar26,0);
    auVar11._0_8_ = dVar27;
    auVar11._12_4_ = (int)((ulong)dVar26 >> 0x20);
    this->step_primal_ = dVar27;
    this->step_dual_ = (double)auVar11._8_8_;
  }
  return;
}

Assistant:

void IPM::StepSizes(const Step& step, bool isCentring) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double gammaf = 0.9;
    const double gammaa = 1.0 / (1.0-gammaf);

    Int block_xl, block_xu, block_zl, block_zu;
    double step_xl = StepToBoundary(xl, dxl, &block_xl);
    double step_xu = StepToBoundary(xu, dxu, &block_xu);
    double step_zl = StepToBoundary(zl, dzl, &block_zl);
    double step_zu = StepToBoundary(zu, dzu, &block_zu);
    double maxp = std::fmin(step_xl, step_xu);
    double maxd = std::fmin(step_zl, step_zu);
    double mufull = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            mufull += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            mufull += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(mufull));
    mufull /= num_finite;
    mufull /= gammaa;

    double alphap = 1.0;
    double alphad = 1.0;
    Int blockp = -1;
    Int blockd = -1;
    if (maxp < 1.0) {
        if (step_xl <= step_xu) {
            double buffer;
            blockp = block_xl;
            buffer = mufull / (zl[blockp] + maxd*dzl[blockp]);
            alphap = (xl[blockp]-buffer) / (-dxl[blockp]);
        } else {
            double buffer;
            blockp = block_xu;
            buffer = mufull / (zu[blockp] + maxd*dzu[blockp]);
            alphap = (xu[blockp]-buffer) / (-dxu[blockp]);
        }
        alphap = std::max(alphap, gammaf*maxp);
        alphap = std::min(alphap, 1.0);
        assert(blockp >= 0.0);
    }
    if (maxd < 1.0) {
        if (step_zl <= step_zu) {
            double buffer;
            blockd = block_zl;
            buffer = mufull / (xl[blockd] + maxp*dxl[blockd]);
            alphad = (zl[blockd]-buffer) / (-dzl[blockd]);
        } else {
            double buffer;
            blockd = block_zu;
            buffer = mufull / (xu[blockd] + maxp*dxu[blockd]);
            alphad = (zu[blockd]-buffer) / (-dzu[blockd]);
        }
        alphad = std::max(alphad, gammaf*maxd);
        alphad = std::min(alphad, 1.0);
        assert(blockd >= 0.0);
    }
    step_primal_ = std::min(alphap, 1.0-1e-6);
    step_dual_   = std::min(alphad, 1.0-1e-6);

    if (isCentring){
        // When computing stepsizes for a centring step, reduce them
        // by centringAlphaScaling. This ensures that the point is 
        // well centred and does not get too close to the boundary.
        step_primal_ = alphap * control_.centringAlphaScaling();
        step_dual_ = alphad * control_.centringAlphaScaling();
    }
}